

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_fails(void)

{
  int iVar1;
  uv_process_t *puVar2;
  undefined8 extraout_RAX;
  uv_process_options_t *puVar3;
  uv_process_t *puVar4;
  undefined8 in_R9;
  
  init_process_options("",fail_cb);
  puVar3 = &options;
  *options.args = "program-that-had-better-not-exist";
  options.file = "program-that-had-better-not-exist";
  puVar2 = (uv_process_t *)uv_default_loop();
  puVar4 = &process;
  iVar1 = uv_spawn(puVar2,&process,&options);
  if ((iVar1 != -0xd) && (iVar1 != -2)) goto LAB_0016c15c;
  puVar2 = &process;
  iVar1 = uv_is_active();
  if (iVar1 == 0) {
    uv_close(&process);
    puVar2 = (uv_process_t *)uv_default_loop();
    puVar4 = (uv_process_t *)0x0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016c152;
    puVar3 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    puVar4 = (uv_process_t *)0x0;
    uv_run(puVar3);
    puVar2 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_fails_cold_1();
LAB_0016c152:
    run_test_spawn_fails_cold_2();
  }
  run_test_spawn_fails_cold_3();
LAB_0016c15c:
  run_test_spawn_fails_cold_4();
  iVar1 = uv_exepath(exepath,&exepath_size);
  if (iVar1 == 0) {
    exepath[exepath_size] = '\0';
    args[0] = exepath;
    args[1] = (char *)puVar2;
    args[2] = (char *)0x0;
    args[3] = (char *)0x0;
    args[4] = (char *)0x0;
    options.file = exepath;
    options.args = args;
    options.exit_cb = (uv_exit_cb)puVar4;
    options.flags = 0;
    return 0x31b850;
  }
  init_process_options_cold_1();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,0x51,"0 && \"fail_cb called\"",in_R9,extraout_RAX,puVar3);
  abort();
}

Assistant:

TEST_IMPL(spawn_fails) {
  int r;

  init_process_options("", fail_cb);
  options.file = options.args[0] = "program-that-had-better-not-exist";

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_ENOENT || r == UV_EACCES);
  ASSERT(0 == uv_is_active((uv_handle_t*) &process));
  uv_close((uv_handle_t*) &process, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}